

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O1

void __thiscall
xray_re::se_sim_faction::state_read(se_sim_faction *this,xr_packet *packet,uint16_t size)

{
  ushort uVar1;
  uchar value;
  uchar value_1;
  uchar value_2;
  uchar value_3;
  uchar value_4;
  uchar value_5;
  unsigned_short value_6;
  char local_20;
  char local_1f;
  char local_1e;
  char local_1d;
  char local_1c;
  char local_1b;
  short local_1a;
  
  cse_alife_smart_zone::state_read(&this->super_cse_alife_smart_zone,packet,size);
  uVar1 = (this->super_cse_alife_smart_zone).super_cse_alife_space_restrictor.
          super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_version;
  if (uVar1 < 0x7a) {
    if ((uVar1 != 0x65) && (uVar1 != 0x76)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x261,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)"
                   );
    }
  }
  else {
    if (0x7c < uVar1) {
      __assert_fail("m_version <= CSE_VERSION_CS",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x24c,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)"
                   );
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"se_sim_faction");
    xr_packet::r_raw(packet,&local_20,1);
    if (local_20 != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x24f,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)"
                   );
    }
    xr_packet::r_raw(packet,&local_1f,1);
    if (local_1f != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x251,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)"
                   );
    }
    xr_packet::r_raw(packet,&local_1e,1);
    if (local_1e != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x253,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)"
                   );
    }
    r_ctime(packet);
    xr_packet::r_raw(packet,&local_1d,1);
    if (local_1d != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x256,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)"
                   );
    }
    xr_packet::r_raw(packet,&local_1c,1);
    if (local_1c != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,600,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1b,1);
    if (local_1b != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x25a,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)"
                   );
    }
    xr_packet::r_raw(packet,&local_1a,2);
    if (local_1a != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x25c,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)"
                   );
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"se_sim_faction");
  }
  return;
}

Assistant:

void se_sim_faction::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_smart_zone::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);
		set_save_marker(packet, SM_LOAD, false, "se_sim_faction");
		if (packet.r_bool())		// community_player
			xr_not_implemented();
		if (packet.r_bool())		// start_position_filled
			xr_not_implemented();
		if (packet.r_u8())		// current_expansion_level
			xr_not_implemented();
		r_ctime(packet);		// last_spawn_time
		if (packet.r_u8())		// #squad_target_cache
			xr_not_implemented();
		if (packet.r_u8())		// #random_tasks
			xr_not_implemented();
		if (packet.r_u8())		// #current_attack_quantity
			xr_not_implemented();
		if (packet.r_u16())		// #squads
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, true, "se_sim_faction");
	} else if (m_version == CSE_VERSION_SOC || m_version == CSE_VERSION_2215) {
		// stub
	} else {
		xr_not_implemented();
	}
}